

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::subdivideSelection(Scene *this,bool useCatmullClark)

{
  HalfedgeMesh *pHVar1;
  Vertex *pVVar2;
  long in_RDI;
  bool in_stack_0000001f;
  Mesh *mesh;
  HalfedgeMesh *this_00;
  Scene *this_01;
  
  if (*(long *)(in_RDI + 0x30) != 0) {
    this_01 = *(Scene **)(in_RDI + 0x30);
    if (this_01 == (Scene *)0x0) {
      pHVar1 = (HalfedgeMesh *)0x0;
    }
    else {
      pHVar1 = (HalfedgeMesh *)__dynamic_cast(this_01,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (pHVar1 != (HalfedgeMesh *)0x0) {
      this_00 = pHVar1;
      HalfedgeMesh::subdivideQuad((HalfedgeMesh *)mesh,in_stack_0000001f);
      clearSelections(this_01);
      *(HalfedgeMesh **)(in_RDI + 0x30) = pHVar1;
      HalfedgeMesh::verticesBegin(this_00);
      pVVar2 = elementAddress((VertexIter)0x201be9);
      *(Vertex **)(in_RDI + 0x38) = pVVar2;
    }
  }
  return;
}

Assistant:

void Scene::subdivideSelection(bool useCatmullClark) {
  if (selected.object == nullptr) return;

  Mesh *mesh = dynamic_cast<Mesh *>(selected.object);
  if (mesh) {
    mesh->mesh.subdivideQuad(useCatmullClark);

    // Old elements are invalid
    clearSelections();

    // Select the subdivided mesh again, so that we can keep hitting
    // the same key to get multiple subdivisions (without having to
    // click on a mesh element).
    selected.object = mesh;
    selected.element = elementAddress(mesh->mesh.verticesBegin());
  }
}